

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCryptoHash.cxx
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
cmCryptoHash::ByteHashFile
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          cmCryptoHash *this,string *file)

{
  bool bVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1268;
  undefined4 local_1250;
  int local_124c;
  char **ppcStack_1248;
  int gcount;
  uchar *buffer_uc;
  char *buffer_c;
  uint64_t buffer [512];
  long local_228;
  ifstream fin;
  string *file_local;
  cmCryptoHash *this_local;
  
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var3 = std::operator|(_S_in,_S_bin);
  std::ifstream::ifstream(&local_228,pcVar4,_Var3);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if (bVar1) {
    Initialize(this);
    buffer_uc = (uchar *)&buffer_c;
    ppcStack_1248 = &buffer_c;
    while (bVar1 = std::ios::operator_cast_to_bool
                             ((ios *)((long)&local_228 + *(long *)(local_228 + -0x18))), bVar1) {
      std::istream::read((char *)&local_228,(long)buffer_uc);
      local_124c = std::istream::gcount();
      if (local_124c != 0) {
        Append(this,ppcStack_1248,(long)local_124c);
      }
    }
    bVar2 = std::ios::eof();
    if ((bVar2 & 1) != 0) {
      Finalize(__return_storage_ptr__,this);
      goto LAB_00634021;
    }
    Finalize(&local_1268,this);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1268);
  }
  memset(__return_storage_ptr__,0,0x18);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(__return_storage_ptr__);
LAB_00634021:
  local_1250 = 1;
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

std::vector<unsigned char> cmCryptoHash::ByteHashFile(const std::string& file)
{
  cmsys::ifstream fin(file.c_str(), std::ios::in | std::ios::binary);
  if (fin) {
    this->Initialize();
    {
      // Should be efficient enough on most system:
      KWIML_INT_uint64_t buffer[512];
      char* buffer_c = reinterpret_cast<char*>(buffer);
      unsigned char const* buffer_uc =
        reinterpret_cast<unsigned char const*>(buffer);
      // This copy loop is very sensitive on certain platforms with
      // slightly broken stream libraries (like HPUX).  Normally, it is
      // incorrect to not check the error condition on the fin.read()
      // before using the data, but the fin.gcount() will be zero if an
      // error occurred.  Therefore, the loop should be safe everywhere.
      while (fin) {
        fin.read(buffer_c, sizeof(buffer));
        if (int gcount = static_cast<int>(fin.gcount())) {
          this->Append(buffer_uc, gcount);
        }
      }
    }
    if (fin.eof()) {
      // Success
      return this->Finalize();
    }
    // Finalize anyway
    this->Finalize();
  }
  // Return without success
  return std::vector<unsigned char>();
}